

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>_> *
__thiscall
tinyusdz::primvar::PrimVar::
get_default_value<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
          (optional<std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>_>
           *__return_storage_ptr__,PrimVar *this)

{
  optional<std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>_>
  local_30;
  
  get_value<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
            (&local_30,this);
  __return_storage_ptr__->has_value_ = local_30.has_value_;
  if (local_30.has_value_ == true) {
    *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->contained =
         local_30.contained.data.__align;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_30.contained._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_30.contained._16_8_;
    local_30.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_30.contained._8_8_ = 0;
    local_30.contained._16_8_ = 0;
  }
  nonstd::optional_lite::
  optional<std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>_>
  ::~optional(&local_30);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }